

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_frost_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int dam;
  int iVar5;
  CHAR_DATA *victim;
  
  act("$n breathes out a freezing cone of frost!",ch,(void *)0x0,vo,1);
  act("$n breathes a freezing cone of frost over you!",ch,(void *)0x0,vo,2);
  act("You breath out a cone of frost.",ch,(void *)0x0,(void *)0x0,3);
  iVar4 = ch->hit;
  iVar3 = dice(level,5);
  iVar3 = iVar3 + iVar4 / 9;
  if (ch->hit <= iVar3) {
    iVar3 = ch->hit;
  }
  iVar4 = iVar3 / 2;
  cold_effect(*(void **)((long)vo + 0xa8),level,iVar4,2);
  dam = iVar3 / 4;
  pCVar1 = *(CHAR_DATA **)(*(long *)((long)vo + 0xa8) + 0x18);
LAB_0030b5a8:
  do {
    victim = pCVar1;
    if (victim == (CHAR_DATA *)0x0) {
      return;
    }
    pCVar1 = victim->next_in_room;
    bVar2 = is_safe(ch,victim);
    if (!bVar2) goto LAB_0030b5e9;
  } while ((victim == ch) || (victim->fighting != (CHAR_DATA *)0x0 && victim->fighting != ch));
  goto LAB_0030b5f1;
LAB_0030b5e9:
  if (victim != ch) {
LAB_0030b5f1:
    iVar5 = iVar4;
    if (victim == (CHAR_DATA *)vo) {
      bVar2 = saves_spell(level,victim,5);
      if (bVar2) {
        cold_effect(victim,level / 2,dam,0);
      }
      else {
        cold_effect(victim,level,iVar3,0);
        iVar5 = iVar3;
      }
    }
    else {
      bVar2 = saves_spell(level + -2,victim,5);
      if (bVar2) {
        cold_effect(victim,level / 4,iVar3 / 8,0);
        iVar5 = dam;
      }
      else {
        cold_effect(victim,level / 2,dam,0);
      }
    }
    damage_old(ch,victim,iVar5,sn,5,true);
  }
  goto LAB_0030b5a8;
}

Assistant:

void spell_frost_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	CHAR_DATA *vch, *vch_next;
	int dam, hp_dam, dice_dam, hpch;

	act("$n breathes out a freezing cone of frost!", ch, nullptr, victim, TO_NOTVICT);
	act("$n breathes a freezing cone of frost over you!", ch, nullptr, victim, TO_VICT);
	act("You breath out a cone of frost.", ch, nullptr, nullptr, TO_CHAR);

	hpch = ch->hit / 9;
	dice_dam = dice(level, 5);
	dam = hpch + dice_dam;

	if (dam > ch->hit)
		dam = ch->hit;

	hp_dam = 0;

	/*
	hpch = std::max(12,ch->hit);
	hp_dam = number_range(hpch/11 + 1, hpch/6);
	dice_dam = dice(level,16);

	dam = std::max(hp_dam + dice_dam/10,dice_dam + hp_dam/10);
	*/

	cold_effect(victim->in_room, level, dam / 2, TARGET_ROOM);

	for (vch = victim->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;
		/*
		if (is_safe_spell(ch,vch,true)
			||  (is_npc(vch) && is_npc(ch) && (ch->fighting != vch || vch->fighting != ch)))
		{
			continue;
		}
		*/

		if ((is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch) || vch == ch)
			continue;

		if (vch == victim) /* full damage */
		{
			if (saves_spell(level, vch, DAM_COLD))
			{
				cold_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_COLD, true);
			}
			else
			{
				cold_effect(vch, level, dam, TARGET_CHAR);
				damage_old(ch, vch, dam, sn, DAM_COLD, true);
			}
		}
		else
		{
			if (saves_spell(level - 2, vch, DAM_COLD))
			{
				cold_effect(vch, level / 4, dam / 8, TARGET_CHAR);
				damage_old(ch, vch, dam / 4, sn, DAM_COLD, true);
			}
			else
			{
				cold_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_COLD, true);
			}
		}
	}
}